

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  string *__k;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  FieldMap *header_00;
  NonBodyFields *pNVar3;
  DataDictionary *pDVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  RequiredTagMissing *pRVar8;
  _Base_ptr p_Var9;
  int delim;
  DataDictionary *local_58;
  DataDictionary *DD;
  
  p_Var6 = (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = this;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->m_headerFields)._M_t._M_impl.super__Rb_tree_header) {
      p_Var6 = (local_58->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar3 = &local_58->m_trailerFields;
      do {
        pDVar4 = local_58;
        if ((_Rb_tree_header *)p_Var6 == &(pNVar3->_M_t)._M_impl.super__Rb_tree_header) {
          __k = &(msgType->super_StringField).super_FieldBase.m_string;
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::find(&(local_58->m_requiredFields)._M_t,__k);
          if ((_Rb_tree_header *)cVar7._M_node !=
              &(pDVar4->m_requiredFields)._M_t._M_impl.super__Rb_tree_header) {
            for (p_Var6 = cVar7._M_node[2]._M_right;
                p_Var6 != (_Base_ptr)&cVar7._M_node[2]._M_parent;
                p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
              bVar5 = FieldMap::isSetField(body,p_Var6[1]._M_color);
              if (!bVar5) {
                pRVar8 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                _Var1 = p_Var6[1]._M_color;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&DD,"",(allocator<char> *)&delim);
                RequiredTagMissing::RequiredTagMissing(pRVar8,_Var1,(string *)&DD);
                __cxa_throw(pRVar8,&RequiredTagMissing::typeinfo,Exception::~Exception);
              }
            }
            for (p_Var6 = (body->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var6 != &(body->m_groups)._M_t._M_impl.super__Rb_tree_header;
                p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
              DD = (DataDictionary *)0x0;
              bVar5 = getGroup(local_58,__k,p_Var6[1]._M_color,&delim,&DD);
              if (bVar5) {
                p_Var2 = p_Var6[1]._M_left;
                for (p_Var9 = p_Var6[1]._M_parent; p_Var9 != p_Var2;
                    p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
                  header_00 = *(FieldMap **)p_Var9;
                  checkHasRequired(DD,header_00,header_00,header_00,msgType);
                }
              }
            }
          }
          return;
        }
        if (p_Var6[1].field_0x4 == '\x01') {
          bVar5 = FieldMap::isSetField(trailer,p_Var6[1]._M_color);
          if (!bVar5) {
            pRVar8 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
            _Var1 = p_Var6[1]._M_color;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&DD,"",(allocator<char> *)&delim);
            RequiredTagMissing::RequiredTagMissing(pRVar8,_Var1,(string *)&DD);
            __cxa_throw(pRVar8,&RequiredTagMissing::typeinfo,Exception::~Exception);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while( true );
    }
    if (p_Var6[1].field_0x4 == '\x01') {
      bVar5 = FieldMap::isSetField(header,p_Var6[1]._M_color);
      if (!bVar5) {
        pRVar8 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
        _Var1 = p_Var6[1]._M_color;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&DD,"",(allocator<char> *)&delim);
        RequiredTagMissing::RequiredTagMissing(pRVar8,_Var1,(string *)&DD);
        __cxa_throw(pRVar8,&RequiredTagMissing::typeinfo,Exception::~Exception);
      }
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

EXCEPT(RequiredTagMissing) {
    for (const NonBodyFields::value_type &NBF : m_headerFields) {
      if (NBF.second == true && !header.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    for (const NonBodyFields::value_type &NBF : m_trailerFields) {
      if (NBF.second == true && !trailer.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    MsgTypeToField::const_iterator iM = m_requiredFields.find(msgType.getString());
    if (iM == m_requiredFields.end()) {
      return;
    }

    const MsgFields &fields = iM->second;
    MsgFields::const_iterator iF;
    for (const MsgFields::value_type &F : fields) {
      if (!body.isSetField(F)) {
        throw RequiredTagMissing(F);
      }
    }

    for (FieldMap::g_const_iterator groups = body.g_begin(); groups != body.g_end(); ++groups) {
      int delim;
      const DataDictionary *DD = 0;
      int field = groups->first;
      if (getGroup(msgType.getValue(), field, delim, DD)) {
        for (const FieldMap *group : groups->second) {
          DD->checkHasRequired(*group, *group, *group, msgType);
        }
      }
    }
  }